

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkBalance(Abc_Ntk_t *pNtk,int fDuplicate,int fSelective,int fUpdateLevel)

{
  long *plVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Ntk_t *pNtkNew;
  void *pvVar4;
  Vec_Vec_t *vStorage;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  ProgressBar *p;
  Abc_Ntk_t *pAVar7;
  char *pString;
  char *pString_00;
  int Counter;
  ulong uVar8;
  int i;
  int iVar9;
  long lVar10;
  
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    if (fSelective != 0) {
      Abc_NtkStartReverseLevels(pNtk,0);
      uVar8 = 0;
      for (iVar9 = 0; iVar9 < pNtk->vObjs->nSize; iVar9 = iVar9 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar9);
        if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
          iVar2 = Abc_ObjRequiredLevel(pAVar3);
          if ((int)(iVar2 - (*(uint *)&pAVar3->field_0x14 >> 0xc)) < 2) {
            *(uint *)&pAVar3->field_0x14 = *(uint *)&pAVar3->field_0x14 | 0x10;
            uVar8 = (ulong)((int)uVar8 + 1);
          }
        }
      }
      printf("The number of nodes on the critical paths = %6d  (%5.2f %%)\n",
             ((double)(int)uVar8 * 100.0) / (double)pNtk->nObjCounts[7],uVar8);
    }
    pNtkNew = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    for (iVar9 = 0; iVar9 < pNtk->vCis->nSize; iVar9 = iVar9 + 1) {
      pvVar4 = Vec_PtrEntry(pNtk->vCis,iVar9);
      *(uint *)(*(long *)((long)pvVar4 + 0x40) + 0x14) =
           *(uint *)(*(long *)((long)pvVar4 + 0x40) + 0x14) & 0xfff |
           *(uint *)((long)pvVar4 + 0x14) & 0xfffff000;
    }
    Abc_NtkSetNodeLevelsArrival(pNtk);
    vStorage = (Vec_Vec_t *)malloc(0x10);
    vStorage->nCap = 10;
    ppvVar5 = (void **)malloc(0x50);
    vStorage->pArray = ppvVar5;
    for (lVar10 = 0; lVar10 != 10; lVar10 = lVar10 + 1) {
      pVVar6 = Vec_PtrAlloc(0);
      ppvVar5[lVar10] = pVVar6;
    }
    vStorage->nSize = 10;
    p = Extra_ProgressBarStart(_stdout,pNtk->vCos->nSize);
    if (pNtk->nBarBufs == 0) {
      for (iVar9 = 0; iVar9 < pNtk->vCos->nSize; iVar9 = iVar9 + 1) {
        pAVar3 = Abc_NtkCo(pNtk,iVar9);
        Extra_ProgressBarUpdate(p,iVar9,pString_00);
        Abc_NodeBalance_rec(pNtkNew,(Abc_Obj_t *)
                                    pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],vStorage,
                            0,fDuplicate,fSelective,fUpdateLevel);
      }
    }
    else {
      for (iVar9 = 0; iVar2 = pNtk->vCos->nSize, iVar9 < iVar2; iVar9 = iVar9 + 1) {
        if (pNtk->nBarBufs <= iVar9) {
          iVar2 = 0;
        }
        pAVar3 = Abc_NtkCo(pNtk,(iVar2 - pNtk->nBarBufs) + iVar9);
        Extra_ProgressBarUpdate(p,iVar9,pString);
        Abc_NodeBalance_rec(pNtkNew,(Abc_Obj_t *)
                                    pAVar3->pNtk->vObjs->pArray[*(pAVar3->vFanins).pArray],vStorage,
                            0,fDuplicate,fSelective,fUpdateLevel);
        if (iVar9 < pNtk->nBarBufs) {
          ppvVar5 = pAVar3->pNtk->vObjs->pArray;
          plVar1 = (long *)ppvVar5[*(pAVar3->vFanouts).pArray];
          lVar10 = *(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[6] * 8)
          ;
          *(uint *)(lVar10 + 0x14) =
               *(uint *)(lVar10 + 0x14) & 0xfff |
               *(uint *)((long)ppvVar5[*(pAVar3->vFanins).pArray] + 0x14) & 0xfffff000;
        }
      }
    }
    Extra_ProgressBarStop(p);
    iVar9 = vStorage->nSize;
    iVar2 = 0;
    if (iVar9 < 1) {
      iVar9 = 0;
      iVar2 = 0;
    }
    for (; iVar9 != iVar2; iVar2 = iVar2 + 1) {
      pVVar6 = Vec_VecEntry(vStorage,iVar2);
      if (pVVar6 != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree(pVVar6);
      }
    }
    Vec_PtrFree((Vec_Ptr_t *)vStorage);
    Abc_NtkFinalize(pNtk,pNtkNew);
    Abc_AigCleanup((Abc_Aig_t *)pNtkNew->pManFunc);
    if (fSelective != 0) {
      Abc_NtkStopReverseLevels(pNtk);
      Abc_NtkCleanMarkA(pNtk);
    }
    if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
      pAVar7 = Abc_NtkDup(pNtk->pExdc);
      pNtkNew->pExdc = pAVar7;
    }
    iVar9 = Abc_NtkCheck(pNtkNew);
    if (iVar9 == 0) {
      puts("Abc_NtkBalance: The network check has failed.");
      Abc_NtkDelete(pNtkNew);
      pNtkNew = (Abc_Ntk_t *)0x0;
    }
    return pNtkNew;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                ,0x39,"Abc_Ntk_t *Abc_NtkBalance(Abc_Ntk_t *, int, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkBalance( Abc_Ntk_t * pNtk, int fDuplicate, int fSelective, int fUpdateLevel )
{
//    extern void Abc_NtkHaigTranfer( Abc_Ntk_t * pNtkOld, Abc_Ntk_t * pNtkNew );
    Abc_Ntk_t * pNtkAig;
    assert( Abc_NtkIsStrash(pNtk) );
    // compute the required times
    if ( fSelective )
    {
        Abc_NtkStartReverseLevels( pNtk, 0 );
        Abc_NtkMarkCriticalNodes( pNtk );
    }
    // perform balancing
    pNtkAig = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // transfer HAIG
//    Abc_NtkHaigTranfer( pNtk, pNtkAig );
    // perform balancing
    Abc_NtkBalancePerform( pNtk, pNtkAig, fDuplicate, fSelective, fUpdateLevel );
    Abc_NtkFinalize( pNtk, pNtkAig );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkAig->pManFunc );
    // undo the required times
    if ( fSelective )
    {
        Abc_NtkStopReverseLevels( pNtk );
        Abc_NtkCleanMarkA( pNtk );
    }
    if ( pNtk->pExdc )
        pNtkAig->pExdc = Abc_NtkDup( pNtk->pExdc );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkAig ) )
    {
        printf( "Abc_NtkBalance: The network check has failed.\n" );
        Abc_NtkDelete( pNtkAig );
        return NULL;
    }
//Abc_NtkPrintCiLevels( pNtkAig );
    return pNtkAig;
}